

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O2

bool __thiscall draco::CornerTable::BreakNonManifoldEdges(CornerTable *this)

{
  uint uVar1;
  pointer pIVar2;
  pointer pIVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  CornerIndex CVar7;
  uint uVar8;
  pointer ppVar9;
  CornerIndex corner;
  uint uVar10;
  uint uVar11;
  size_type __n;
  ulong __n_00;
  bool bVar12;
  reference rVar13;
  value_type local_80;
  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  sink_vertices;
  vector<bool,_std::allocator<bool>_> visited_corners;
  
  sink_vertices.
  super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)sink_vertices.
                        super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_corners,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (bool *)&sink_vertices,(allocator_type *)&local_80);
  sink_vertices.
  super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sink_vertices.
  super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sink_vertices.
  super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n_00 = 0;
  bVar12 = false;
  do {
    while (((ulong)((long)(this->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= __n_00) {
      __n_00 = 0;
      bVar5 = !bVar12;
      bVar12 = false;
      if (bVar5) {
        std::
        _Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
        ::~_Vector_base(&sink_vertices.
                         super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                       );
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&visited_corners.super__Bvector_base<std::allocator<bool>_>);
        return true;
      }
    }
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_corners,__n_00);
    if ((*rVar13._M_p & rVar13._M_mask) == 0) {
      if (sink_vertices.
          super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          sink_vertices.
          super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sink_vertices.
        super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             sink_vertices.
             super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar6 = __n_00 & 0xffffffff;
      do {
        __n = uVar6;
        corner.value_ = (uint)__n;
        CVar7 = SwingLeft(this,corner);
        if ((__n_00 == CVar7.value_) || (CVar7.value_ == 0xffffffff)) break;
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&visited_corners,(ulong)CVar7.value_);
        uVar6 = (ulong)CVar7.value_;
      } while ((*rVar13._M_p & rVar13._M_mask) == 0);
      do {
        CVar7.value_ = (uint)__n;
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_corners,__n);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
        uVar4 = CVar7.value_ - 2;
        if ((CVar7.value_ + 1) % 3 != 0) {
          uVar4 = CVar7.value_ + 1;
        }
        pIVar2 = (this->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = (this->opposite_corners_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (-(uint)((int)(__n % 3) != 0) | 2) + CVar7.value_;
        for (ppVar9 = sink_vertices.
                      super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar9 != sink_vertices.
                      super__Vector_base<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
          if ((ppVar9->first).value_ == pIVar2[uVar4].value_) {
            uVar10 = 0xffffffff;
            uVar11 = uVar10;
            if (uVar8 != 0xffffffff) {
              uVar11 = pIVar3[uVar8].value_;
            }
            uVar1 = (ppVar9->second).value_;
            if (uVar11 != uVar1) {
              if (uVar1 != 0xffffffff) {
                uVar10 = pIVar3[uVar1].value_;
              }
              if (uVar11 != 0xffffffff) {
                pIVar3[uVar11].value_ = 0xffffffff;
              }
              if (uVar10 != 0xffffffff) {
                pIVar3[uVar10].value_ = 0xffffffff;
              }
              pIVar3[uVar8].value_ = 0xffffffff;
              pIVar3[uVar1].value_ = 0xffffffff;
              bVar12 = true;
              goto LAB_0013ca28;
            }
          }
        }
        local_80.first.value_ = pIVar2[uVar8].value_;
        local_80.second.value_ = uVar4;
        std::
        vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
        ::push_back(&sink_vertices,&local_80);
        CVar7 = SwingRight(this,CVar7);
        __n = (size_type)CVar7.value_;
      } while ((CVar7.value_ != corner.value_) && (CVar7.value_ != 0xffffffff));
    }
LAB_0013ca28:
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

bool CornerTable::BreakNonManifoldEdges() {
  // This function detects and breaks non-manifold edges that are caused by
  // folds in 1-ring neighborhood around a vertex. Non-manifold edges can occur
  // when the 1-ring surface around a vertex self-intersects in a common edge.
  // For example imagine a surface around a pivot vertex 0, where the 1-ring
  // is defined by vertices |1, 2, 3, 1, 4|. The surface passes edge <0, 1>
  // twice which would result in a non-manifold edge that needs to be broken.
  // For now all faces connected to these non-manifold edges are disconnected
  // resulting in open boundaries on the mesh. New vertices will be created
  // automatically for each new disjoint patch in the ComputeVertexCorners()
  // method.
  // Note that all other non-manifold edges are implicitly handled by the
  // function ComputeVertexCorners() that automatically creates new vertices
  // on disjoint 1-ring surface patches.

  std::vector<bool> visited_corners(num_corners(), false);
  std::vector<std::pair<VertexIndex, CornerIndex>> sink_vertices;
  bool mesh_connectivity_updated = false;
  do {
    mesh_connectivity_updated = false;
    for (CornerIndex c(0); c < num_corners(); ++c) {
      if (visited_corners[c.value()]) {
        continue;
      }
      sink_vertices.clear();

      // First swing all the way to find the left-most corner connected to the
      // corner's vertex.
      CornerIndex first_c = c;
      CornerIndex current_c = c;
      CornerIndex next_c;
      while (next_c = SwingLeft(current_c),
             next_c != first_c && next_c != kInvalidCornerIndex &&
                 !visited_corners[next_c.value()]) {
        current_c = next_c;
      }

      first_c = current_c;

      // Swing right from the first corner and check if all visited edges
      // are unique.
      do {
        visited_corners[current_c.value()] = true;
        // Each new edge is defined by the pivot vertex (that is the same for
        // all faces) and by the sink vertex (that is the |next| vertex from the
        // currently processed pivot corner. I.e., each edge is uniquely defined
        // by the sink vertex index.
        const CornerIndex sink_c = Next(current_c);
        const VertexIndex sink_v = corner_to_vertex_map_[sink_c];

        // Corner that defines the edge on the face.
        const CornerIndex edge_corner = Previous(current_c);
        bool vertex_connectivity_updated = false;
        // Go over all processed edges (sink vertices). If the current sink
        // vertex has been already encountered before it may indicate a
        // non-manifold edge that needs to be broken.
        for (auto &&attached_sink_vertex : sink_vertices) {
          if (attached_sink_vertex.first == sink_v) {
            // Sink vertex has been already processed.
            const CornerIndex other_edge_corner = attached_sink_vertex.second;
            const CornerIndex opp_edge_corner = Opposite(edge_corner);

            if (opp_edge_corner == other_edge_corner) {
              // We are closing the loop so no need to change the connectivity.
              continue;
            }

            // Break the connectivity on the non-manifold edge.
            // TODO(ostava): It may be possible to reconnect the faces in a way
            // that the final surface would be manifold.
            const CornerIndex opp_other_edge_corner =
                Opposite(other_edge_corner);
            if (opp_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_edge_corner, kInvalidCornerIndex);
            }
            if (opp_other_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_other_edge_corner, kInvalidCornerIndex);
            }

            SetOppositeCorner(edge_corner, kInvalidCornerIndex);
            SetOppositeCorner(other_edge_corner, kInvalidCornerIndex);

            vertex_connectivity_updated = true;
            break;
          }
        }
        if (vertex_connectivity_updated) {
          // Because of the updated connectivity, not all corners connected to
          // this vertex have been processed and we need to go over them again.
          // TODO(ostava): This can be optimized as we don't really need to
          // iterate over all corners.
          mesh_connectivity_updated = true;
          break;
        }
        // Insert new sink vertex information <sink vertex index, edge corner>.
        std::pair<VertexIndex, CornerIndex> new_sink_vert;
        new_sink_vert.first = corner_to_vertex_map_[Previous(current_c)];
        new_sink_vert.second = sink_c;
        sink_vertices.push_back(new_sink_vert);

        current_c = SwingRight(current_c);
      } while (current_c != first_c && current_c != kInvalidCornerIndex);
    }
  } while (mesh_connectivity_updated);
  return true;
}